

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O0

QPainterPath anon_unknown.dwarf_d603ce::intersectPath(QPainterPath *path,QRectF *rect)

{
  bool bVar1;
  int iVar2;
  QPainterPath *other;
  qsizetype qVar3;
  ulong uVar4;
  QRectF *in_RDX;
  QPainterPathPrivate *in_RDI;
  long in_FS_OFFSET;
  qreal qVar5;
  qreal qVar6;
  int i;
  QRectF bounds;
  QPainterPath subPath;
  QPainterPath result;
  QList<QPainterPath> subpaths;
  QPainterPath *in_stack_fffffffffffffef8;
  QList<QPainterPath> *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  FillRule fillRule;
  QPainterPath *in_stack_ffffffffffffff10;
  QExplicitlySharedDataPointer<QPainterPathPrivate> path_00;
  int local_cc;
  QRectF local_b0;
  qreal local_80;
  qreal local_78;
  qreal local_70;
  qreal local_68;
  QRectF local_50;
  undefined1 *local_30;
  undefined1 *local_28;
  QList<QPainterPath> local_20;
  long local_8;
  
  fillRule = (FillRule)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QPainterPath *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  path_00.d.ptr =
       (totally_ordered_wrapper<QPainterPathPrivate_*>)
       (totally_ordered_wrapper<QPainterPathPrivate_*>)in_RDI;
  toSubpaths((QPainterPath *)in_RDX);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)0x5d355f);
  QPainterPath::fillRule((QPainterPath *)in_stack_ffffffffffffff00);
  QPainterPath::setFillRule(in_stack_ffffffffffffff10,fillRule);
  local_cc = 0;
  while( true ) {
    other = (QPainterPath *)(long)local_cc;
    qVar3 = QList<QPainterPath>::size(&local_20);
    if (qVar3 <= (long)other) break;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QPainterPath>::at(in_stack_ffffffffffffff00,(qsizetype)in_stack_fffffffffffffef8);
    QPainterPath::QPainterPath((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_50.xp = -NAN;
    local_50.yp = -NAN;
    local_50.w = -NAN;
    local_50.h = -NAN;
    QPainterPath::boundingRect(in_stack_ffffffffffffff10);
    uVar4 = QRectF::intersects((QRectF *)&local_50);
    if ((uVar4 & 1) != 0) {
      in_stack_ffffffffffffff10 = (QPainterPath *)QRectF::left(&local_50);
      qVar5 = QRectF::left(in_RDX);
      if ((double)in_stack_ffffffffffffff10 < qVar5) {
        QRectF::left(in_RDX);
        clip<((anonymous_namespace)::Edge)0>((QPainterPath *)path_00.d.ptr,(qreal)in_RDI);
        QPainterPath::operator=((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        QPainterPath::~QPainterPath((QPainterPath *)0x5d36af);
      }
      qVar5 = QRectF::right(&local_50);
      qVar6 = QRectF::right(in_RDX);
      if (qVar6 < qVar5) {
        QRectF::right(in_RDX);
        clip<((anonymous_namespace)::Edge)2>((QPainterPath *)path_00.d.ptr,(qreal)in_RDI);
        QPainterPath::operator=((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        QPainterPath::~QPainterPath((QPainterPath *)0x5d371c);
      }
      QPainterPath::boundingRect(in_stack_ffffffffffffff10);
      local_50.xp = local_80;
      local_50.yp = local_78;
      local_50.w = local_70;
      local_50.h = local_68;
      in_stack_ffffffffffffff00 = (QList<QPainterPath> *)QRectF::top(&local_50);
      qVar5 = QRectF::top(in_RDX);
      if ((double)in_stack_ffffffffffffff00 < qVar5) {
        QRectF::top(in_RDX);
        clip<((anonymous_namespace)::Edge)1>((QPainterPath *)path_00.d.ptr,(qreal)in_RDI);
        QPainterPath::operator=((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        QPainterPath::~QPainterPath((QPainterPath *)0x5d37db);
      }
      in_stack_fffffffffffffef8 = (QPainterPath *)QRectF::bottom(&local_50);
      qVar5 = QRectF::bottom(in_RDX);
      if (qVar5 < (double)in_stack_fffffffffffffef8) {
        QRectF::bottom(in_RDX);
        clip<((anonymous_namespace)::Edge)3>((QPainterPath *)path_00.d.ptr,(qreal)in_RDI);
        QPainterPath::operator=((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8)
        ;
        QPainterPath::~QPainterPath((QPainterPath *)0x5d383d);
      }
      iVar2 = QPainterPath::elementCount((QPainterPath *)in_stack_ffffffffffffff00);
      if (1 < iVar2) {
        QPainterPath::addPath((QPainterPath *)in_RDI,other);
      }
    }
    QPainterPath::~QPainterPath((QPainterPath *)0x5d3873);
    local_cc = local_cc + 1;
  }
  QPainterPath::boundingRect(in_stack_ffffffffffffff10);
  bVar1 = QRectF::isEmpty(&local_b0);
  if (bVar1) {
    QPainterPath::QPainterPath((QPainterPath *)0x5d38af);
  }
  else {
    QPainterPath::QPainterPath((QPainterPath *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  QPainterPath::~QPainterPath((QPainterPath *)0x5d38e0);
  QList<QPainterPath>::~QList((QList<QPainterPath> *)0x5d38ed);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)path_00.d.ptr;
}

Assistant:

QPainterPath intersectPath(const QPainterPath &path, const QRectF &rect)
{
    QList<QPainterPath> subpaths = toSubpaths(path);

    QPainterPath result;
    result.setFillRule(path.fillRule());
    for (int i = 0; i < subpaths.size(); ++i) {
        QPainterPath subPath = subpaths.at(i);
        QRectF bounds = subPath.boundingRect();
        if (bounds.intersects(rect)) {
            if (bounds.left() < rect.left())
                subPath = clip<Left>(subPath, rect.left());
            if (bounds.right() > rect.right())
                subPath = clip<Right>(subPath, rect.right());

            bounds = subPath.boundingRect();

            if (bounds.top() < rect.top())
                subPath = clip<Top>(subPath, rect.top());
            if (bounds.bottom() > rect.bottom())
                subPath = clip<Bottom>(subPath, rect.bottom());

            if (subPath.elementCount() > 1)
                result.addPath(subPath);
        }
    }
    // The algorithm above might return one side of \a rect if there was no intersection,
    // so only return intersections that are not empty rectangles.
    if (result.boundingRect().isEmpty())
        return QPainterPath();
    else
        return result;
}